

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O3

string * __thiscall
cmExportTryCompileFileGenerator::FindTargets
          (string *__return_storage_ptr__,cmExportTryCompileFileGenerator *this,string *propName,
          cmGeneratorTarget *tgt,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *emitted)

{
  pointer *pppcVar1;
  _Rb_tree_node_base *__v;
  iterator __position;
  Snapshot snapshot;
  auto_ptr<cmCompiledGeneratorExpression> this_00;
  cmGeneratorTarget *this_01;
  string *target;
  cmLocalGenerator *pcVar2;
  char *pcVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_header *p_Var5;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar6;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmTarget dummyHead;
  cmGeneratorTarget gDummyHead;
  allocator local_909;
  auto_ptr<cmCompiledGeneratorExpression> local_908;
  string *local_900;
  char *local_8f8;
  cmGeneratorTarget *local_8f0;
  string local_8e8;
  cmGeneratorExpression local_8c8;
  Snapshot local_888;
  cmGeneratorExpressionDAGChecker local_870;
  undefined1 local_7a8 [32];
  _Base_ptr local_788;
  undefined1 local_530 [1280];
  
  local_8f8 = cmGeneratorTarget::GetProperty(tgt,propName);
  if (local_8f8 == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_900 = __return_storage_ptr__;
    local_8f0 = tgt;
    cmState::Snapshot::Snapshot(&local_888,(cmState *)0x0);
    local_7a8._8_8_ = 0;
    local_7a8[0x10] = '\0';
    local_788 = (_Base_ptr)0x0;
    snapshot.Position.Tree = local_888.Position.Tree;
    snapshot.State = local_888.State;
    snapshot.Position.Position = local_888.Position.Position;
    local_7a8._0_8_ = local_7a8 + 0x10;
    cmListFileBacktrace::cmListFileBacktrace
              ((cmListFileBacktrace *)local_530,snapshot,(cmCommandContext *)local_7a8);
    cmGeneratorExpression::cmGeneratorExpression(&local_8c8,(cmListFileBacktrace *)local_530);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_530);
    if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
      operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
    }
    this_01 = local_8f0;
    target = cmGeneratorTarget::GetName_abi_cxx11_(local_8f0);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&local_870,target,propName,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_530,(char *)&local_8c8);
    local_908.x_ = (cmCompiledGeneratorExpression *)local_530._0_8_;
    local_530._0_8_ = (pointer)0x0;
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_530);
    cmTarget::cmTarget((cmTarget *)local_7a8);
    local_530._0_8_ = local_530 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_530,"try_compile_dummy_exe","");
    cmTarget::SetType((cmTarget *)local_7a8,EXECUTABLE,(string *)local_530);
    if ((undefined1 *)local_530._0_8_ != local_530 + 0x10) {
      operator_delete((void *)local_530._0_8_,local_530._16_8_ + 1);
    }
    cmTarget::SetMakefile((cmTarget *)local_7a8,this_01->Target->Makefile);
    pcVar2 = cmGeneratorTarget::GetLocalGenerator(this_01);
    cmGeneratorTarget::cmGeneratorTarget
              ((cmGeneratorTarget *)local_530,(cmTarget *)local_7a8,pcVar2);
    this_00.x_ = local_908.x_;
    pcVar2 = cmGeneratorTarget::GetLocalGenerator(this_01);
    local_8e8._M_string_length = 0;
    local_8e8.field_2._M_local_buf[0] = '\0';
    local_8e8._M_dataplus._M_p = (pointer)&local_8e8.field_2;
    pcVar3 = cmCompiledGeneratorExpression::Evaluate
                       (this_00.x_,pcVar2,&this->Config,false,(cmGeneratorTarget *)local_530,this_01
                        ,&local_870,&local_8e8);
    std::__cxx11::string::string((string *)local_900,pcVar3,&local_909);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8e8._M_dataplus._M_p != &local_8e8.field_2) {
      operator_delete(local_8e8._M_dataplus._M_p,
                      CONCAT71(local_8e8.field_2._M_allocated_capacity._1_7_,
                               local_8e8.field_2._M_local_buf[0]) + 1);
    }
    p_Var4 = ((local_908.x_)->AllTargetsSeen)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var5 = &((local_908.x_)->AllTargetsSeen)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var5) {
      do {
        __v = p_Var4 + 1;
        pVar6 = std::
                _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                ::_M_insert_unique<cmGeneratorTarget_const*const&>
                          ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                            *)emitted,(cmGeneratorTarget **)__v);
        if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          __position._M_current =
               (this->Exports).
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->Exports).
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
            _M_realloc_insert<cmGeneratorTarget_const*const&>
                      ((vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
                       &this->Exports,__position,(cmGeneratorTarget **)__v);
          }
          else {
            *__position._M_current = *(cmGeneratorTarget **)__v;
            pppcVar1 = &(this->Exports).
                        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppcVar1 = *pppcVar1 + 1;
          }
        }
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var5);
    }
    cmGeneratorTarget::~cmGeneratorTarget((cmGeneratorTarget *)local_530);
    cmTarget::~cmTarget((cmTarget *)local_7a8);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_908);
    cmListFileBacktrace::~cmListFileBacktrace(&local_870.Backtrace);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_870.Seen._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_870.Property._M_dataplus._M_p != &local_870.Property.field_2) {
      operator_delete(local_870.Property._M_dataplus._M_p,
                      local_870.Property.field_2._M_allocated_capacity + 1);
    }
    __return_storage_ptr__ = local_900;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_870.Target._M_dataplus._M_p != &local_870.Target.field_2) {
      operator_delete(local_870.Target._M_dataplus._M_p,
                      local_870.Target.field_2._M_allocated_capacity + 1);
    }
    cmGeneratorExpression::~cmGeneratorExpression(&local_8c8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportTryCompileFileGenerator::FindTargets(
                                  const std::string& propName,
                                  cmGeneratorTarget const* tgt,
                                  std::set<cmGeneratorTarget const*> &emitted)
{
  const char *prop = tgt->GetProperty(propName);
  if(!prop)
    {
    return std::string();
    }

  cmGeneratorExpression ge;

  cmGeneratorExpressionDAGChecker dagChecker(
                                      tgt->GetName(),
                                      propName, 0, 0);

  cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(prop);

  cmTarget dummyHead;
  dummyHead.SetType(cmState::EXECUTABLE, "try_compile_dummy_exe");
  dummyHead.SetMakefile(tgt->Target->GetMakefile());

  cmGeneratorTarget gDummyHead(&dummyHead, tgt->GetLocalGenerator());

  std::string result = cge->Evaluate(tgt->GetLocalGenerator(), this->Config,
                                     false, &gDummyHead,
                                     tgt, &dagChecker);

  const std::set<cmGeneratorTarget const*> &allTargets =
      cge->GetAllTargetsSeen();
  for(std::set<cmGeneratorTarget const*>::const_iterator li =
      allTargets.begin(); li != allTargets.end(); ++li)
    {
    if(emitted.insert(*li).second)
      {
      this->Exports.push_back(*li);
      }
    }
  return result;
}